

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::AddressBook::Clear(AddressBook *this)

{
  uint32 cached_has_bits;
  AddressBook *this_local;
  
  google::protobuf::RepeatedPtrField<Messages::Person>::Clear(&this->people_);
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8);
  }
  return;
}

Assistant:

void AddressBook::Clear() {
// @@protoc_insertion_point(message_clear_start:Messages.AddressBook)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  people_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}